

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall FNodeBuilder::FindUsedVertices(FNodeBuilder *this,vertex_t *oldverts,int max)

{
  line_t *plVar1;
  int iVar2;
  int iVar3;
  int *__s;
  long lVar4;
  FLevel *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined8 local_40 [2];
  
  uVar9 = 0xffffffffffffffff;
  if (-1 < max) {
    uVar9 = (long)max * 4;
  }
  __s = (int *)operator_new__(uVar9);
  memset(__s,0xff,(long)max * 4);
  pFVar5 = this->Level;
  lVar6 = 8;
  for (lVar10 = 0; lVar10 < pFVar5->NumLines; lVar10 = lVar10 + 1) {
    lVar7 = *(long *)((long)pFVar5->Lines->args + lVar6 + -0x2c);
    lVar8 = *(long *)((long)pFVar5->Lines->args + lVar6 + -0x34) - (long)oldverts;
    lVar4 = lVar8 / 0xe;
    iVar2 = *(int *)((long)__s + lVar4);
    if (iVar2 == -1) {
      local_40[0] = CONCAT44(SUB84(((double *)((long)oldverts + lVar8))[1] + 103079215104.0,0),
                             SUB84(*(double *)((long)oldverts + lVar8) + 103079215104.0,0));
      iVar2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40,lVar8 % 0xe);
      *(int *)((long)__s + lVar4) = iVar2;
    }
    lVar7 = lVar7 - (long)oldverts;
    iVar3 = *(int *)((long)__s + lVar7 / 0xe);
    if (iVar3 == -1) {
      local_40[0] = CONCAT44(SUB84(((double *)((long)oldverts + lVar7))[1] + 103079215104.0,0),
                             SUB84(*(double *)((long)oldverts + lVar7) + 103079215104.0,0));
      iVar3 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40,lVar7 % 0xe);
      *(int *)((long)__s + lVar7 / 0xe) = iVar3;
      iVar2 = *(int *)((long)__s + lVar4);
    }
    pFVar5 = this->Level;
    plVar1 = pFVar5->Lines;
    *(long *)((long)plVar1->args + lVar6 + -0x34) = (long)iVar2;
    *(long *)((long)plVar1->args + lVar6 + -0x2c) = (long)iVar3;
    lVar6 = lVar6 + 0x98;
  }
  this->OldVertexTable = __s;
  return;
}

Assistant:

void FNodeBuilder::FindUsedVertices (vertex_t *oldverts, int max)
{
	int *map = new int[max];
	int i;
	FPrivVert newvert;

	memset (&map[0], -1, sizeof(int)*max);

	for (i = 0; i < Level.NumLines; ++i)
	{
		ptrdiff_t v1 = Level.Lines[i].v1 - oldverts;
		ptrdiff_t v2 = Level.Lines[i].v2 - oldverts;

		if (map[v1] == -1)
		{
			newvert.x = oldverts[v1].fixX();
			newvert.y = oldverts[v1].fixY();
			map[v1] = VertexMap->SelectVertexExact (newvert);
		}
		if (map[v2] == -1)
		{
			newvert.x = oldverts[v2].fixX();
			newvert.y = oldverts[v2].fixY();
			map[v2] = VertexMap->SelectVertexExact (newvert);
		}

		Level.Lines[i].v1 = (vertex_t *)(size_t)map[v1];
		Level.Lines[i].v2 = (vertex_t *)(size_t)map[v2];
	}
	OldVertexTable = map;
}